

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_edf1.c
# Opt level: O2

void gga_xc_edf1_init(xc_func_type *p)

{
  xc_mix_init(p,4,gga_xc_edf1_init::funcs_id,gga_xc_edf1_init::funcs_coef);
  xc_func_set_ext_params(p->func_aux[1],gga_xc_edf1_init::par_x_b88);
  xc_func_set_ext_params(p->func_aux[3],gga_xc_edf1_init::par_c_lyp);
  return;
}

Assistant:

static void
gga_xc_edf1_init(xc_func_type *p)
{
  static int    funcs_id  [4] = {XC_LDA_X, XC_GGA_X_B88, XC_GGA_X_B88, XC_GGA_C_LYP};
  static double funcs_coef[4] = {1.030952 - 10.4017 + 8.44793, 10.4017, -8.44793, 1.0};

  static double par_x_b88[] = {0.0035, 6.0};
  static double par_c_lyp[] = {0.055, 0.158, 0.25, 0.3505};

  xc_mix_init(p, 4, funcs_id, funcs_coef);

  xc_func_set_ext_params(p->func_aux[1], par_x_b88);
  xc_func_set_ext_params(p->func_aux[3], par_c_lyp);
}